

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O3

void duckdb::UncompressedStringInitPrefetch(ColumnSegment *segment,PrefetchState *prefetch_state)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_t sVar2;
  BlockManager *block_id;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> manager_p;
  BlockHandle *pBVar3;
  size_t sVar4;
  shared_ptr<duckdb::BlockHandle,_true> block_handle;
  optional_ptr<duckdb::CompressedSegmentState,_true> segment_state;
  shared_ptr<duckdb::BlockHandle,_true> local_68;
  undefined1 local_58 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_38;
  
  local_58._16_8_ =
       (segment->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_40 = (segment->block).internal.
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  PrefetchState::AddBlock(prefetch_state,(shared_ptr<duckdb::BlockHandle,_true> *)(local_58 + 0x10))
  ;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  local_38._M_head_impl =
       (segment->segment_state).
       super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
       .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  if (local_38._M_head_impl != (CompressedSegmentState *)0x0) {
    optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
              ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_38);
    manager_p._M_head_impl = local_38._M_head_impl;
    pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
    sVar4 = *(size_t *)&((_Prime_rehash_policy *)(manager_p._M_head_impl + 0xb))->_M_max_load_factor
    ;
    sVar2 = *(size_t *)(manager_p._M_head_impl + 0xc);
    if (sVar4 != sVar2) {
      block_id = pBVar3->block_manager;
      do {
        UncompressedStringSegmentState::GetHandle
                  ((UncompressedStringSegmentState *)local_58,(BlockManager *)manager_p._M_head_impl
                   ,(block_id_t)block_id);
        local_68.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_58._0_8_;
        local_68.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
        if ((StringBlock *)local_58._8_8_ != (StringBlock *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(((shared_ptr<duckdb::BlockHandle,_true> *)local_58._8_8_)->internal).
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var1 = &(((shared_ptr<duckdb::BlockHandle,_true> *)local_58._8_8_)->internal).
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          }
        }
        PrefetchState::AddBlock(prefetch_state,&local_68);
        if (local_68.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.internal.
                     super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        if ((_Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>)
            local_58._8_8_ != (StringBlock *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
        sVar4 = sVar4 + 8;
      } while (sVar4 != sVar2);
    }
  }
  return;
}

Assistant:

void UncompressedStringInitPrefetch(ColumnSegment &segment, PrefetchState &prefetch_state) {
	prefetch_state.AddBlock(segment.block);
	auto segment_state = segment.GetSegmentState();
	if (segment_state) {
		auto &state = segment_state->Cast<UncompressedStringSegmentState>();
		auto &block_manager = segment.GetBlockManager();
		for (auto &block_id : state.on_disk_blocks) {
			auto block_handle = state.GetHandle(block_manager, block_id);
			prefetch_state.AddBlock(block_handle);
		}
	}
}